

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O2

Writer * mp::operator<<(Writer *w,NLHeader *h)

{
  BasicWriter<char> *pBVar1;
  int i;
  long lVar2;
  int local_30;
  int local_2c;
  
  pBVar1 = fmt::BasicWriter<char>::operator<<
                     (w,((h->super_NLInfo).super_NLInfo_C.format == 0) * '\x05' + 'b');
  fmt::BasicWriter<char>::write_decimal<int>
            (pBVar1,(h->super_NLInfo).super_NLInfo_C.num_ampl_options);
  for (lVar2 = 0; lVar2 < (h->super_NLInfo).super_NLInfo_C.num_ampl_options; lVar2 = lVar2 + 1) {
    pBVar1 = fmt::BasicWriter<char>::operator<<(w,' ');
    fmt::BasicWriter<char>::write_decimal<long>
              (pBVar1,(h->super_NLInfo).super_NLInfo_C.ampl_options[lVar2]);
  }
  if ((h->super_NLInfo).super_NLInfo_C.ampl_options[1] == 3) {
    pBVar1 = fmt::BasicWriter<char>::operator<<(w,' ');
    fmt::BasicWriter<char>::operator<<(pBVar1,(h->super_NLInfo).super_NLInfo_C.ampl_vbtol);
  }
  fmt::BasicWriter<char>::operator<<(w,'\n');
  fmt::BasicWriter<char>::write<int,int,int,int,int,int>
            (w,(BasicCStringRef<char>)0x20e3a7,(int *)h,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_objs,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_ranges,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_eqns,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons);
  local_2c = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_conds -
             (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_compl_conds;
  fmt::BasicWriter<char>::write<int,int,int,int,int,int>
            (w,(BasicCStringRef<char>)0x20e3a7,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_cons,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_objs,&local_2c,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_compl_conds,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_dbl_ineqs,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_vars_with_nz_lb);
  fmt::BasicWriter<char>::write<int,int>
            (w,(BasicCStringRef<char>)0x20e3b3,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_net_cons,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_net_cons);
  fmt::BasicWriter<char>::write<int,int,int>
            (w,(BasicCStringRef<char>)0x20e3b0,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_objs,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both);
  local_30 = (h->super_NLInfo).super_NLInfo_C.format;
  if (local_30 != 0) {
    local_30 = (h->super_NLInfo).super_NLInfo_C.arith_kind;
  }
  fmt::BasicWriter<char>::write<int,int,int,int>
            (w,(BasicCStringRef<char>)0x20e3ad,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_net_vars,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs,&local_30,
             &(h->super_NLInfo).super_NLInfo_C.flags);
  fmt::BasicWriter<char>::write<int,int,int,int,int>
            (w,(BasicCStringRef<char>)0x20e3aa,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_binary_vars,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_integer_vars,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_both,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_cons,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_objs);
  fmt::BasicWriter<char>::write<unsigned_long,unsigned_long>
            (w,(BasicCStringRef<char>)0x20e3b3,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_con_nonzeros,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_obj_nonzeros);
  fmt::BasicWriter<char>::write<int,int>
            (w,(BasicCStringRef<char>)0x20e3b3,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.max_con_name_len,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.max_var_name_len);
  fmt::BasicWriter<char>::write<int,int,int,int,int>
            (w,(BasicCStringRef<char>)0x20e3aa,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons,
             &(h->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs);
  return w;
}

Assistant:

fmt::Writer &mp::operator<<(fmt::Writer &w, const NLHeader &h) {
  w << (h.format == NLHeader::TEXT ? 'g' : 'b') << h.num_ampl_options;
  for (int i = 0; i < h.num_ampl_options; ++i)
    w << ' ' << h.ampl_options[i];
  if (h.ampl_options[USE_VBTOL_OPTION] == READ_VBTOL)
    w << ' ' << h.ampl_vbtol;
  w << '\n';
  w.write(" {} {} {} {} {} {}\n",
      h.num_vars, h.num_algebraic_cons, h.num_objs,
      h.num_ranges, h.num_eqns, h.num_logical_cons);
  w.write(" {} {} {} {} {} {}\n",
      h.num_nl_cons, h.num_nl_objs,
      h.num_compl_conds - h.num_nl_compl_conds,
      h.num_nl_compl_conds, h.num_compl_dbl_ineqs,
      h.num_compl_vars_with_nz_lb);
  w.write(" {} {}\n", h.num_nl_net_cons, h.num_linear_net_cons);
  w.write(" {} {} {}\n",
      h.num_nl_vars_in_cons, h.num_nl_vars_in_objs, h.num_nl_vars_in_both);
  w.write(" {} {} {} {}\n",
      h.num_linear_net_vars, h.num_funcs,
          h.format == NLHeader::TEXT ? 0 : h.arith_kind, h.flags);
  w.write(" {} {} {} {} {}\n",
      h.num_linear_binary_vars, h.num_linear_integer_vars,
      h.num_nl_integer_vars_in_both, h.num_nl_integer_vars_in_cons,
      h.num_nl_integer_vars_in_objs);
  w.write(" {} {}\n", h.num_con_nonzeros, h.num_obj_nonzeros);
  w.write(" {} {}\n", h.max_con_name_len, h.max_var_name_len);
  w.write(" {} {} {} {} {}\n",
      h.num_common_exprs_in_both, h.num_common_exprs_in_cons,
      h.num_common_exprs_in_objs, h.num_common_exprs_in_single_cons,
      h.num_common_exprs_in_single_objs);
  return w;
}